

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::ByteSizeLong(SimpleRecurrentLayerParams *this)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (this->activation_ == (ActivationParams *)0x0 ||
      this == (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ActivationParams>(this->activation_);
    sVar2 = sVar2 + 1;
  }
  if (this->weightmatrix_ != (WeightParams *)0x0 &&
      this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->weightmatrix_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  if (this->recursionmatrix_ != (WeightParams *)0x0 &&
      this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->recursionmatrix_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  if (this->biasvector_ != (WeightParams *)0x0 &&
      this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->biasvector_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar4 = this->inputvectorsize_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->outputvectorsize_ != 0) {
    uVar4 = this->outputvectorsize_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = sVar2 + 2;
  if (this->sequenceoutput_ == false) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 3;
  if (this->hasbiasvector_ == false) {
    sVar2 = sVar3;
  }
  sVar3 = sVar2 + 3;
  if (this->reverseinput_ == false) {
    sVar3 = sVar2;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t SimpleRecurrentLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SimpleRecurrentLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.ActivationParams activation = 10;
  if (this->has_activation()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->activation_);
  }

  // .CoreML.Specification.WeightParams weightMatrix = 30;
  if (this->has_weightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weightmatrix_);
  }

  // .CoreML.Specification.WeightParams recursionMatrix = 31;
  if (this->has_recursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->recursionmatrix_);
  }

  // .CoreML.Specification.WeightParams biasVector = 32;
  if (this->has_biasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->biasvector_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVector = 20;
  if (this->hasbiasvector() != 0) {
    total_size += 2 + 1;
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}